

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O1

AST * parse_shift_expression(Translation_Data *translation_data,Scope *scope)

{
  int iVar1;
  AST_Binary_Expression *left;
  AST *right;
  AST_Type type;
  
  left = (AST_Binary_Expression *)parse_additive_expression(translation_data,scope);
  do {
    if (translation_data->tokens->size == 0) {
      return (AST *)left;
    }
    iVar1 = *translation_data->tokens->first->data;
    type = OP_SHIFT_LEFT;
    if (iVar1 != 0x40) {
      if (iVar1 != 0x3f) {
        return (AST *)left;
      }
      type = OP_SHIFT_RIGHT;
    }
    chomp(translation_data);
    right = parse_additive_expression(translation_data,scope);
    left = get_binary_expression_tree((AST *)left,right,type);
  } while( true );
}

Assistant:

struct AST* parse_shift_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	
	struct AST *hold;
	hold=parse_additive_expression(translation_data,scope);

	while(translation_data->tokens->size!=0)
	{
		switch(((struct token*)translation_data->tokens->first->data)->type)
		{
			case KW_SHIFT_LEFT:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_additive_expression(translation_data,scope),OP_SHIFT_LEFT);
				break;
			case KW_SHIFT_RIGHT:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_additive_expression(translation_data,scope),OP_SHIFT_RIGHT);
				break;
			default:
				return hold;
		}
	}
	return hold;
}